

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O0

void addExpression_T100(MidiFile *midifile)

{
  int iVar1;
  ostream *this;
  undefined1 local_58 [8];
  MidiEvent me;
  int rewind;
  int expressiontrack;
  int tracks;
  MidiFile *midifile_local;
  
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  if (iVar1 != 5) {
    this = std::operator<<((ostream *)&std::cerr,
                           "This program expects a five-track MIDI file to process");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  smf::MidiFile::addTrack(midifile);
  me.m_eventlink._4_4_ = getRewindTime(midifile,4);
  smf::MidiEvent::MidiEvent((MidiEvent *)local_58);
  me.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = me.m_eventlink._4_4_;
  me.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 5;
  smf::MidiMessage::makeController((MidiMessage *)local_58,1,7,0);
  smf::MidiFile::addEvent(midifile,(MidiEvent *)local_58);
  smf::MidiMessage::makeController((MidiMessage *)local_58,2,7,0);
  smf::MidiFile::addEvent(midifile,(MidiEvent *)local_58);
  addSustainPedalling(midifile,4,5);
  addSoftPedalling(midifile,4,5);
  smf::MidiFile::sortTracks(midifile);
  smf::MidiEvent::~MidiEvent((MidiEvent *)local_58);
  return;
}

Assistant:

void addExpression_T100(MidiFile& midifile) {
	int tracks = midifile.getTrackCount();
	if (tracks != 5) {
		cerr << "This program expects a five-track MIDI file to process" << endl;
		exit(1);
	}

	// add a new track with some of the expression components (pedal)
	midifile.addTrack();

	int expressiontrack = 5;
	int rewind = getRewindTime(midifile, 4);
	MidiEvent me;
	me.tick = rewind;
	me.track = expressiontrack;

	me.makeController(1, 7, 0);  // mute for any post-rewind holes: bass
	midifile.addEvent(me);
	me.makeController(2, 7, 0);  // mute for any post-rewind holes: treble
	midifile.addEvent(me);

	addSustainPedalling(midifile, 4, expressiontrack);
	addSoftPedalling(midifile, 4, expressiontrack);

	midifile.sortTracks();
}